

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  size_t size_00;
  size_t size_01;
  uint error;
  size_t size;
  size_t textsize;
  size_t keysize;
  uchar *chunk;
  char *textstring_local;
  char *keyword_local;
  ucvector *out_local;
  
  keysize = 0;
  chunk = (uchar *)textstring;
  textstring_local = keyword;
  keyword_local = (char *)out;
  size_00 = lodepng_strlen(keyword);
  size_01 = lodepng_strlen((char *)chunk);
  if ((size_00 == 0) || (0x4f < size_00)) {
    out_local._4_4_ = 0x59;
  }
  else {
    out_local._4_4_ =
         lodepng_chunk_init((uchar **)&keysize,(ucvector *)keyword_local,size_00 + 1 + size_01,
                            "tEXt");
    if (out_local._4_4_ == 0) {
      lodepng_memcpy((void *)(keysize + 8),textstring_local,size_00);
      *(undefined1 *)(keysize + size_00 + 8) = 0;
      lodepng_memcpy((void *)(keysize + 9 + size_00),chunk,size_01);
      lodepng_chunk_generate_crc((uchar *)keysize);
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring) {
  unsigned char* chunk = 0;
  size_t keysize = lodepng_strlen(keyword), textsize = lodepng_strlen(textstring);
  size_t size = keysize + 1 + textsize;
  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, size, "tEXt"));
  lodepng_memcpy(chunk + 8, keyword, keysize);
  chunk[8 + keysize] = 0; /*null termination char*/
  lodepng_memcpy(chunk + 9 + keysize, textstring, textsize);
  lodepng_chunk_generate_crc(chunk);
  return 0;
}